

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

void __thiscall
AddIRCCommand::trigger
          (AddIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ModGroup *group;
  ulong uVar5;
  Server *server;
  PlayerInfo *player;
  undefined8 uVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split_1;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  
  pcVar9 = nick._M_str;
  sVar7 = nick._M_len;
  parameters_split_1.first._M_len = parameters._M_len;
  parameters_split_1.first._M_str = parameters._M_str;
  local_78._M_len = 2;
  local_78._M_str = " \t";
  jessilib::
  word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&parameters_split,&parameters_split_1.first,&local_78);
  if (parameters_split.second._M_len == 0) {
    pcVar8 = "Error: Too few parameters. Syntax: add <level> <player>";
    uVar6 = 0x37;
  }
  else {
    lVar4 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar4 == 0) {
      return;
    }
    Jupiter::IRC::Client::Channel::getType();
    if ((int)*parameters._M_str - 0x30U < 10) {
      local_78._M_len = parameters._M_len;
      local_78._M_str = parameters._M_str;
      local_60._M_len = 2;
      local_60._M_str = " \t";
      jessilib::
      word_split_once<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
                (&parameters_split_1,&local_78,&local_60);
      uVar3 = Jupiter_strtoi_s(parameters_split_1.first._M_str,parameters_split_1.first._M_len,0);
      if (((int)uVar3 < 0) ||
         ((int)pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node._M_size <= (int)uVar3)) {
        Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar9,0x1b,"Error: Invalid group index.");
      }
      else {
        group = RenX_ModSystemPlugin::getGroupByIndex(&pluginInstance,(ulong)uVar3);
        if (group != (ModGroup *)0x0) {
          bVar2 = false;
          uVar3 = 0;
          do {
            RenX::getCore();
            uVar5 = RenX::Core::getServerCount();
            if (uVar5 == uVar3) {
              if (bVar2) {
                return;
              }
              Jupiter::IRC::Client::sendMessage
                        (source,channel._M_len,channel._M_str,0x40,
                         "Error: Channel not attached to any connected Renegade X servers.");
              return;
            }
            uVar5 = RenX::getCore();
            server = (Server *)RenX::Core::getServer(uVar5);
            cVar1 = RenX::Server::isLogChanType((int)server);
            if (cVar1 != '\0') {
              player = (PlayerInfo *)
                       RenX::Server::getPlayerByPartName
                                 (server,parameters_split_1.second._M_len,
                                  parameters_split_1.second._M_str);
              if (player == (PlayerInfo *)0x0) {
                uVar6 = 0x18;
                pcVar8 = "Error: Player not found.";
LAB_00110f95:
                Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar9,uVar6,pcVar8);
              }
              else {
                if (player->isBot == true) {
                  uVar6 = 0x24;
                  pcVar8 = "Error: A bot can not be a moderator.";
                  goto LAB_00110f95;
                }
                if ((player->uuid)._M_string_length == 0) {
                  uVar6 = 0x1a;
                  pcVar8 = "Error: Player has no UUID.";
                  goto LAB_00110f95;
                }
                RenX_ModSystemPlugin::resetAccess(&pluginInstance,player);
                bVar2 = RenX_ModSystemPlugin::set(&pluginInstance,player,group);
                if (bVar2) {
                  string_printf_abi_cxx11_
                            ((string *)&parameters_split_1,"%.*s has been added to group \"%.*s\"",
                             (player->name)._M_string_length,(player->name)._M_dataplus._M_p,
                             (group->name)._M_string_length,(group->name)._M_dataplus._M_p);
                  Jupiter::IRC::Client::sendNotice
                            (source,sVar7,pcVar9,parameters_split_1.first._M_str,
                             parameters_split_1.first._M_len);
                }
                else {
                  string_printf_abi_cxx11_
                            ((string *)&parameters_split_1,"%.*s has been moved to group \"%.*s\"",
                             (player->name)._M_string_length,(player->name)._M_dataplus._M_p,
                             (group->name)._M_string_length,(group->name)._M_dataplus._M_p);
                  Jupiter::IRC::Client::sendNotice
                            (source,sVar7,pcVar9,parameters_split_1.first._M_str,
                             parameters_split_1.first._M_len);
                }
                std::__cxx11::string::~string((string *)&parameters_split_1);
                RenX_ModSystemPlugin::auth(&pluginInstance,server,player,false,true);
              }
              bVar2 = true;
            }
            uVar3 = uVar3 + 1;
          } while( true );
        }
      }
    }
    pcVar8 = "Error: Invalid group.";
    uVar6 = 0x15;
  }
  Jupiter::IRC::Client::sendNotice(source,sVar7,pcVar9,uVar6,pcVar8);
  return;
}

Assistant:

void AddIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		source->sendNotice(nick, "Error: Too few parameters. Syntax: add <level> <player>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		RenX::Server *server;
		RenX::PlayerInfo *player;
		RenX_ModSystemPlugin::ModGroup *group = nullptr;
		int type = chan->getType();
		bool serverMatch = false;
		std::string_view playerName = parameters;
		if (isdigit(parameters[0])) {
			auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
			int index = Jupiter::asInt(parameters_split.first);

			if (index < 0 || index >= static_cast<int>(pluginInstance.groups.size())) {
				source->sendNotice(nick, "Error: Invalid group index."sv);
			}
			else {
				group = pluginInstance.getGroupByIndex(index);
				playerName = parameters_split.second;
			}
		}
		if (group == nullptr)
			source->sendNotice(nick, "Error: Invalid group."sv);
		else {
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type)) {
					serverMatch = true;
					player = server->getPlayerByPartName(playerName);
					if (player == nullptr)
						source->sendNotice(nick, "Error: Player not found."sv);
					else if (player->isBot)
						source->sendNotice(nick, "Error: A bot can not be a moderator."sv);
					else if (player->uuid.empty())
						source->sendNotice(nick, "Error: Player has no UUID."sv);
					else {
						pluginInstance.resetAccess(*player);
						if (pluginInstance.set(*player, *group))
							source->sendNotice(nick, string_printf("%.*s has been added to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						else
							source->sendNotice(nick, string_printf("%.*s has been moved to group \"%.*s\"", player->name.size(), player->name.data(), group->name.size(), group->name.data()));
						pluginInstance.auth(*server, *player, false, true);
					}
				}
			}
			if (serverMatch == false)
				source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		}
	}
}